

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::HttpByteRange>_>::size
          (Delimited<kj::ArrayPtr<const_kj::HttpByteRange>_> *this)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar4;
  
  ensureStringifiedInitialized(this);
  sVar1 = (this->stringified).size_;
  lVar5 = 0;
  if (sVar1 == 0) {
    sVar3 = 0;
  }
  else {
    lVar6 = 1;
    lVar7 = 0;
    sVar3 = 0;
    do {
      lVar8 = (this->delimiter).content.size_ - 1;
      if (lVar6 != 0) {
        lVar8 = lVar5;
        lVar6 = lVar5;
      }
      lVar2 = *(long *)((long)&(((this->stringified).ptr)->content).size_ + lVar7);
      lVar4 = lVar2 + -1;
      if (lVar2 == 0) {
        lVar4 = lVar5;
      }
      sVar3 = lVar4 + lVar8 + sVar3;
      lVar7 = lVar7 + 0x18;
    } while (sVar1 * 0x18 != lVar7);
  }
  return sVar3;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }